

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Chunk.cpp
# Opt level: O0

void __thiscall Chunk::Chunk(Chunk *this,LodRenderer *lodRenderer,repr coords)

{
  int iVar1;
  undefined8 in_RDX;
  undefined8 in_RSI;
  void *in_RDI;
  StaticInit *in_stack_00000080;
  void *local_30;
  
  local_30 = in_RDI;
  do {
    memset(local_30,0,4);
    local_30 = (void *)((long)local_30 + 4);
  } while (local_30 != (void *)((long)in_RDI + 0x1000));
  std::
  unique_ptr<std::unique_ptr<Entity,std::default_delete<Entity>>[],std::default_delete<std::unique_ptr<Entity,std::default_delete<Entity>>[]>>
  ::unique_ptr<std::default_delete<std::unique_ptr<Entity,std::default_delete<Entity>>[]>,void>
            ((unique_ptr<std::unique_ptr<Entity,_std::default_delete<Entity>_>[],_std::default_delete<std::unique_ptr<Entity,_std::default_delete<Entity>_>[]>_>
              *)((long)in_RDI + 0x1000));
  *(undefined8 *)((long)in_RDI + 0x1008) = 0;
  *(undefined8 *)((long)in_RDI + 0x1010) = in_RSI;
  *(undefined8 *)((long)in_RDI + 0x1018) = in_RDX;
  std::bitset<4UL>::bitset((bitset<4UL> *)0x271ee9);
  *(undefined1 *)((long)in_RDI + 0x1028) = 1;
  *(undefined1 *)((long)in_RDI + 0x1029) = 0;
  if (Chunk(LodRenderer*,unsigned_long)::staticInit == '\0') {
    iVar1 = __cxa_guard_acquire(&Chunk(LodRenderer*,unsigned_long)::staticInit);
    if (iVar1 != 0) {
      StaticInit::StaticInit(in_stack_00000080);
      __cxa_guard_release(&Chunk(LodRenderer*,unsigned_long)::staticInit);
    }
  }
  staticInit_ = &Chunk::staticInit;
  return;
}

Assistant:

Chunk::Chunk(LodRenderer* lodRenderer, ChunkCoords::repr coords) :
    tiles_{},
    entities_(),
    entitiesCapacity_(0),
    lodRenderer_(lodRenderer),
    coords_(coords),
    dirtyFlags_(),
    empty_(true), 
    highlighted_(false) {

    static StaticInit staticInit;
    staticInit_ = &staticInit;
}